

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O3

void NULLCCanvas::CanvasClearRGBA(float red,float green,float blue,float alpha,Canvas *ptr)

{
  char *pcVar1;
  uint uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  
  if (ptr != (Canvas *)0x0) {
    uVar2 = ptr->height * ptr->width;
    if (0 < (int)uVar2) {
      auVar4._4_4_ = green;
      auVar4._0_4_ = red;
      auVar4._12_4_ = alpha;
      auVar4._8_4_ = blue;
      auVar4 = divps(auVar4,_DAT_001eb080);
      pcVar1 = (ptr->data).ptr;
      lVar3 = 0;
      do {
        *(undefined1 (*) [16])(pcVar1 + lVar3) = auVar4;
        lVar3 = lVar3 + 0x10;
      } while ((ulong)uVar2 << 4 != lVar3);
    }
    return;
  }
  nullcThrowError("ERROR: Canvas object is nullptr");
  return;
}

Assistant:

void CanvasClearRGBA(float red, float green, float blue, float alpha, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		float fRed = red / 255.0f;
		float fGreen = green / 255.0f;
		float fBlue = blue / 255.0f;
		float fAlpha = alpha / 255.0f;
		for(int i = 0; i < ptr->width * ptr->height; i++)
		{
			((float*)ptr->data.ptr)[i * 4 + 0] = fRed;
			((float*)ptr->data.ptr)[i * 4 + 1] = fGreen;
			((float*)ptr->data.ptr)[i * 4 + 2] = fBlue;
			((float*)ptr->data.ptr)[i * 4 + 3] = fAlpha;
		}
	}